

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void __thiscall
soul::FunctionBuilder::addBranch
          (FunctionBuilder *this,Block *target,ArgListType *targetArgs,
          pool_ptr<soul::heart::Block> *subsequentBlock)

{
  pool_ptr<soul::heart::Block> local_38;
  Branch *local_30;
  Branch *branch;
  pool_ptr<soul::heart::Block> *subsequentBlock_local;
  ArgListType *targetArgs_local;
  Block *target_local;
  FunctionBuilder *this_local;
  
  branch = (Branch *)subsequentBlock;
  subsequentBlock_local = (pool_ptr<soul::heart::Block> *)targetArgs;
  targetArgs_local = (ArgListType *)target;
  target_local = (Block *)this;
  local_30 = Module::allocate<soul::heart::Branch,soul::heart::Block&>
                       ((this->super_BlockBuilder).module,target);
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::operator=
            (&local_30->targetArgs,
             (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
             subsequentBlock_local);
  local_38 = (pool_ptr<soul::heart::Block>)subsequentBlock->object;
  addTerminatorStatement(this,&local_30->super_Terminator,&local_38);
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_38);
  return;
}

Assistant:

void addBranch (heart::Block& target, heart::Branch::ArgListType&& targetArgs, pool_ptr<heart::Block> subsequentBlock)
    {
        auto& branch = module.allocate<heart::Branch> (target);

        branch.targetArgs = std::move (targetArgs);

        addTerminatorStatement (branch, subsequentBlock);
    }